

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

Path * Pathie::Path::runtime_dir(void)

{
  char *pcVar1;
  ostream *poVar2;
  Path *in_RDI;
  Path local_e0;
  undefined1 local_b9;
  undefined4 local_b8;
  allocator local_b1;
  string local_b0 [32];
  Pathie local_90 [32];
  char *local_70;
  char *env_value;
  allocator local_51;
  string local_50 [32];
  Pathie local_30 [8];
  string nstr;
  Path *tmp;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"XDG_RUNTIME_DIR",&local_51);
  utf8_to_filename(local_30,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pcVar1 = getenv(pcVar1);
  local_70 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    local_b9 = 0;
    temp_dir();
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "(pathie XDG) WARNING: XDG_RUNTIME_DIR not defined in environment. Falling back to \'"
                            );
    str_abi_cxx11_(&local_e0);
    poVar2 = std::operator<<(poVar2,(string *)&local_e0);
    poVar2 = std::operator<<(poVar2,"\'.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_e0);
    local_b9 = 1;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
    filename_to_utf8(local_90,(string *)local_b0);
    Path(in_RDI,(string *)local_90);
    std::__cxx11::string::~string((string *)local_90);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  local_b8 = 1;
  std::__cxx11::string::~string((string *)local_30);
  return in_RDI;
}

Assistant:

Path Path::runtime_dir()
{
#if defined(_PATHIE_UNIX)
  std::string nstr = utf8_to_filename("XDG_RUNTIME_DIR"); // environment is encoded the same as paths
  char* env_value = getenv(nstr.c_str());
  if (env_value)
    return Path(filename_to_utf8(env_value));

  Path tmp = Path::temp_dir();
  std::cerr << "(pathie XDG) WARNING: XDG_RUNTIME_DIR not defined in environment. Falling back to '" << tmp.str() << "'." << std::endl;

  return tmp;
#elif defined(_WIN32)
  return temp_dir();
#else
#error Unsupported system.
#endif
}